

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerAngles
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  SurfaceMesh *pSVar2;
  size_t sVar3;
  pointer puVar4;
  double *pdVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  runtime_error *this_00;
  long *plVar9;
  ulong uVar10;
  size_type *psVar11;
  long *plVar12;
  ParentMeshT *pPVar13;
  ulong uVar14;
  size_t i;
  ulong uVar15;
  size_t sVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 local_e8 [24];
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->edgeLengthsQ).super_DependentQuantity.computed == false) {
    if ((this->edgeLengthsQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc);
    (this->edgeLengthsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Corner,_double>::MeshData
            ((MeshData<geometrycentral::surface::Corner,_double> *)local_e8,
             (this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Corner,_double>::operator=
            (&this->cornerAngles,(MeshData<geometrycentral::surface::Corner,_double> *)local_e8);
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Corner,_double> *)local_e8);
  pSVar2 = (this->super_BaseGeometryInterface).mesh;
  sVar3 = pSVar2->nHalfedgesFillCount;
  if ((sVar3 == 0) ||
     ((puVar4 = (pSVar2->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar4 != 0xffffffffffffffff &&
      (*(pSVar2->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start < pSVar2->nFacesFillCount)))) {
    uVar15 = 0;
  }
  else {
    sVar16 = 1;
    uVar15 = sVar16;
    if (sVar3 != 1) {
      do {
        if ((puVar4[sVar16] != 0xffffffffffffffff) &&
           (uVar15 = sVar16,
           (pSVar2->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar16] < pSVar2->nFacesFillCount)) break;
        sVar16 = sVar16 + 1;
        uVar15 = sVar3;
      } while (sVar3 != sVar16);
    }
  }
  do {
    do {
      if (uVar15 == sVar3) {
        return;
      }
      puVar4 = (pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = puVar4[uVar15];
      uVar8 = puVar4[uVar10];
      if (puVar4[uVar8] != uVar15) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
                   ,"");
        ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_b0);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_70);
        local_128._M_dataplus._M_p = (pointer)*plVar9;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((size_type *)local_128._M_dataplus._M_p == psVar11) {
          local_128.field_2._M_allocated_capacity = *psVar11;
          local_128.field_2._8_8_ = plVar9[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar11;
        }
        local_128._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::to_string(&local_90,0x75);
        ::std::operator+(&local_50,&local_128,&local_90);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_50);
        local_108 = (long *)*plVar9;
        plVar12 = plVar9 + 2;
        if (local_108 == plVar12) {
          local_f8 = *plVar12;
          lStack_f0 = plVar9[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar12;
        }
        local_100 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_108);
        local_e8._0_8_ = *plVar9;
        pPVar13 = (ParentMeshT *)(plVar9 + 2);
        if ((ParentMeshT *)local_e8._0_8_ == pPVar13) {
          local_e8._16_8_ = pPVar13->_vptr_SurfaceMesh;
          lStack_d0 = plVar9[3];
          local_e8._0_8_ = (ParentMeshT *)(local_e8 + 0x10);
        }
        else {
          local_e8._16_8_ = pPVar13->_vptr_SurfaceMesh;
        }
        local_e8._8_8_ = plVar9[1];
        *plVar9 = (long)pPVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::runtime_error::runtime_error(this_00,(string *)local_e8);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (pSVar2->useImplicitTwinFlag == true) {
        uVar10 = uVar10 >> 1;
      }
      else {
        uVar10 = (pSVar2->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
      }
      if (pSVar2->useImplicitTwinFlag == false) {
        uVar14 = (pSVar2->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15];
        uVar8 = (pSVar2->heEdgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
      }
      else {
        uVar14 = uVar15 >> 1;
        uVar8 = uVar8 >> 1;
      }
      pdVar5 = (this->edgeLengths).data.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = pdVar5[uVar10];
      dVar17 = pdVar5[uVar14];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar17;
      dVar1 = pdVar5[uVar8];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar1 * dVar1;
      auVar19 = vfmadd231sd_fma(auVar21,auVar19,auVar19);
      auVar19 = vfnmadd231sd_fma(auVar19,auVar18,auVar18);
      auVar20._0_8_ = auVar19._0_8_ / ((dVar17 + dVar17) * dVar1);
      auVar20._8_8_ = auVar19._8_8_;
      auVar19 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar20);
      uVar6 = vcmpsd_avx512f(ZEXT816(0x3ff0000000000000),auVar20,1);
      bVar7 = (bool)((byte)uVar6 & 1);
      dVar17 = acos((double)((ulong)bVar7 * 0x3ff0000000000000 + (ulong)!bVar7 * auVar19._0_8_));
      (this->cornerAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data[uVar15] = dVar17;
      sVar16 = uVar15 + 1;
      uVar15 = sVar16;
    } while (sVar16 == sVar3);
    do {
      if (((pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar16] != 0xffffffffffffffff) &&
         (uVar15 = sVar16,
         (pSVar2->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start[sVar16] < pSVar2->nFacesFillCount)) break;
      sVar16 = sVar16 + 1;
      uVar15 = sVar3;
    } while (sVar3 != sVar16);
  } while( true );
}

Assistant:

void IntrinsicGeometryInterface::computeCornerAngles() {
  edgeLengthsQ.ensureHave();

  cornerAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    // WARNING: Logic duplicated between cached and immediate version
    Halfedge heA = c.halfedge();
    Halfedge heOpp = heA.next();
    Halfedge heB = heOpp.next();

    GC_SAFETY_ASSERT(heB.next() == heA, "faces must be triangular");

    double lOpp = edgeLengths[heOpp.edge()];
    double lA = edgeLengths[heA.edge()];
    double lB = edgeLengths[heB.edge()];

    double q = (lA * lA + lB * lB - lOpp * lOpp) / (2. * lA * lB);
    q = clamp(q, -1.0, 1.0);
    double angle = std::acos(q);

    cornerAngles[c] = angle;
  }
}